

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

Symbol left_section_op(Env *env,uint32_t start)

{
  Space SVar1;
  int32_t iVar2;
  Symbol SVar3;
  
  SVar3 = FAIL;
  if (env->symbols[0x27] == true) {
    advance_before(env,start);
    SVar1 = skip_whitespace(env);
    iVar2 = peek(env,start);
    if (iVar2 == 0x29) {
      SVar3 = LEFT_SECTION_OP;
    }
    else {
      SVar3 = FAIL;
      if (SVar1 != NoSpace) {
        SVar3 = NO_SECTION_OP;
        if (env->symbols[0x28] == false) {
          SVar3 = FAIL;
        }
      }
    }
  }
  return SVar3;
}

Assistant:

static Symbol left_section_op(Env *env, uint32_t start) {
  if (valid(env, LEFT_SECTION_OP)) {
    advance_before(env, start);
    Space space = skip_whitespace(env);
    if (char_at(env, start, ')')) return finish(LEFT_SECTION_OP, "left section");
    if (space != NoSpace) return finish_if_valid(env, NO_SECTION_OP, "left section");
  }
  return FAIL;
}